

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O2

void __thiscall
QUntypedBindable::QUntypedBindable
          (QUntypedBindable *this,QObject *obj,char *property,QBindableInterface *i)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QDebug *this_00;
  long in_FS_OFFSET;
  QMetaProperty local_68;
  QDebug local_40;
  char *local_38;
  
  local_38 = *(char **)(in_FS_OFFSET + 0x28);
  if (obj != (QObject *)0x0) {
    iVar1 = (**obj->_vptr_QObject)(obj);
    iVar1 = QMetaObject::indexOfProperty((QMetaObject *)CONCAT44(extraout_var,iVar1),property);
    if (-1 < iVar1) {
      iVar2 = (**obj->_vptr_QObject)(obj);
      QMetaObject::property(&local_68,(QMetaObject *)CONCAT44(extraout_var_00,iVar2),iVar1);
      goto LAB_0029857c;
    }
    lcQPropertyBinding();
    if (((byte)lcQPropertyBinding::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        != 0) {
      local_68.mobj._0_4_ = 2;
      local_68.mobj._4_4_ = 0;
      local_68.data.d._0_4_ = 0;
      local_68.data.d._4_4_ = 0;
      local_68.menum.mobj._0_4_ = 0;
      local_68.menum.mobj._4_4_ = 0;
      local_68.menum.data.d = (uint *)lcQPropertyBinding::category.name;
      QMessageLogger::warning((QMessageLogger *)&local_40);
      this_00 = QDebug::operator<<(&local_40,"QUntypedBindable: No property named");
      QDebug::operator<<(this_00,property);
      QDebug::~QDebug(&local_40);
    }
  }
  local_68.menum.mobj._0_4_ = 0;
  local_68.menum.mobj._4_4_ = 0;
  local_68.menum.data.d = (uint *)0x0;
  local_68.mobj._0_4_ = 0;
  local_68.mobj._4_4_ = 0;
  local_68.data.d._0_4_ = 0;
  local_68.data.d._4_4_ = 0;
LAB_0029857c:
  QUntypedBindable(this,obj,&local_68,i);
  if (*(char **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUntypedBindable::QUntypedBindable(QObject *obj, const char *property,
                                   const QtPrivate::QBindableInterface *i)
    : QUntypedBindable(
            obj,
            [=]() -> QMetaProperty {
                if (!obj)
                    return {};
                auto propertyIndex = obj->metaObject()->indexOfProperty(property);
                if (propertyIndex < 0) {
                    qCWarning(lcQPropertyBinding)
                            << "QUntypedBindable: No property named" << property;
                    return {};
                }
                return obj->metaObject()->property(propertyIndex);
            }(),
            i)
{
}